

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O0

int __thiscall ktx::OptionsMultiInSingleOut::init(OptionsMultiInSingleOut *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  OptionAdder *__s;
  string *in_stack_fffffffffffffce8;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffffcf0;
  Options *this_00;
  allocator<char> *in_stack_fffffffffffffd20;
  allocator<char> *__a;
  char *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string *in_stack_fffffffffffffd40;
  Options *in_stack_fffffffffffffd48;
  allocator<char> local_281;
  string local_280 [8];
  string *in_stack_fffffffffffffd88;
  Options *in_stack_fffffffffffffd90;
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [64];
  string *in_stack_fffffffffffffe10;
  shared_ptr<const_cxxopts::Value> *in_stack_fffffffffffffe18;
  string *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  OptionAdder *in_stack_fffffffffffffe30;
  allocator<char> local_1c1;
  string local_1c0 [39];
  undefined1 local_199 [72];
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [71];
  allocator<char> local_b9;
  string local_b8 [39];
  allocator<char> local_91;
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [72];
  Options *local_10;
  OptionsMultiInSingleOut *local_8;
  
  local_10 = (Options *)ctx;
  local_8 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  cxxopts::Options::add_options(in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffffcf0,(shared_ptr<cxxopts::Value> *)in_stack_fffffffffffffce8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  cxxopts::value<bool>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffffcf0,(shared_ptr<cxxopts::Value> *)in_stack_fffffffffffffce8);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_199;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  __s = cxxopts::OptionAdder::operator()
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                   in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  __a = &local_1c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  std::shared_ptr<cxxopts::Value_const>::shared_ptr<cxxopts::Value,void>
            (in_stack_fffffffffffffcf0,(shared_ptr<cxxopts::Value> *)in_stack_fffffffffffffce8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  cxxopts::OptionAdder::operator()
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20f5c2);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20f5cf);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe17);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::string::~string((string *)(local_199 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_199);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20f62a);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20f637);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::shared_ptr<const_cxxopts::Value>::~shared_ptr((shared_ptr<const_cxxopts::Value> *)0x20f692);
  std::shared_ptr<cxxopts::Value>::~shared_ptr((shared_ptr<cxxopts::Value> *)0x20f69f);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  cxxopts::OptionAdder::~OptionAdder((OptionAdder *)0x20f6e0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  cxxopts::Options::parse_positional(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator(&local_259);
  this_00 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,__a);
  cxxopts::Options::positional_help(this_00,in_stack_fffffffffffffce8);
  std::__cxx11::string::~string(local_280);
  iVar1 = std::allocator<char>::~allocator(&local_281);
  return iVar1;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("stdin", "Use stdin as the first input file. (Using a single dash '-' as the first input file has the same effect)")
                ("stdout", "Use stdout as the output file. (Using a single dash '-' as the output file has the same effect)")
                ("files", "Input/output files. Last file specified will be used as output."
                          " Using a single dash '-' as an input or output file will use stdin/stdout.", cxxopts::value<std::vector<std::string>>(), "<filepath>");
        opts.parse_positional("files");
        opts.positional_help("<input-file...> <output-file>");
    }